

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O2

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateE
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int i;
  int iVar8;
  ValueType *pVVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int k;
  int iVar13;
  int k_00;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  dVar20 = dt * -12.56637061432;
  dVar22 = dt * 29979245800.0;
  dVar23 = dVar22 / (grid->super_Grid<(pica::Dimension)3,_double>).step.x;
  dVar21 = dVar22 / (grid->super_Grid<(pica::Dimension)3,_double>).step.y;
  dVar22 = dVar22 / (grid->super_Grid<(pica::Dimension)3,_double>).step.z;
  uVar6 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.x;
  uVar7 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
  iVar12 = uVar7 + -1;
  iVar13 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.z + -1;
  i = uVar6 + -1;
  iVar10 = 0;
  if (0 < iVar13) {
    iVar10 = iVar13;
  }
  iVar11 = 0;
  if (0 < iVar12) {
    iVar11 = iVar12;
  }
  iVar15 = 0;
  iVar18 = 0;
  if (0 < i) {
    iVar18 = i;
  }
  while (iVar14 = iVar15, iVar14 != iVar18) {
    iVar15 = iVar14 + 1;
    iVar8 = 0;
    while (iVar17 = iVar8, iVar17 != iVar11) {
      iVar8 = iVar17 + 1;
      iVar16 = iVar10;
      k = 0;
      while (bVar19 = iVar16 != 0, iVar16 = iVar16 + -1, bVar19) {
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::jx(grid,iVar14,iVar17,k);
        dVar1 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar14,iVar8,k);
        dVar2 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar14,iVar17,k);
        dVar3 = *pVVar9;
        k_00 = k + 1;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar14,iVar17,k_00);
        dVar4 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar14,iVar17,k);
        dVar5 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar14,iVar17,k);
        *pVVar9 = (dVar4 - dVar5) * -dVar22 + (dVar2 - dVar3) * dVar21 + dVar1 * dVar20 + *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::jy(grid,iVar14,iVar17,k);
        dVar1 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar14,iVar17,k_00);
        dVar2 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar14,iVar17,k);
        dVar3 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar15,iVar17,k);
        dVar4 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar14,iVar17,k);
        dVar5 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar14,iVar17,k);
        *pVVar9 = (dVar4 - dVar5) * -dVar23 + (dVar2 - dVar3) * dVar22 + dVar1 * dVar20 + *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::jz(grid,iVar14,iVar17,k);
        dVar1 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar15,iVar17,k);
        dVar2 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar14,iVar17,k);
        dVar3 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar14,iVar8,k);
        dVar4 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar14,iVar17,k);
        dVar5 = *pVVar9;
        pVVar9 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar14,iVar17,k);
        *pVVar9 = (dVar4 - dVar5) * -dVar21 + (dVar2 - dVar3) * dVar23 + dVar1 * dVar20 + *pVVar9;
        k = k_00;
      }
    }
  }
  iVar15 = 0;
  while (iVar14 = iVar15, iVar14 != iVar18) {
    iVar8 = iVar11;
    iVar17 = 0;
    while (bVar19 = iVar8 != 0, iVar8 = iVar8 + -1, iVar15 = iVar14 + 1, bVar19) {
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::jz(grid,iVar14,iVar17,iVar13);
      dVar1 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar14 + 1,iVar17,iVar13);
      dVar2 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar14,iVar17,iVar13);
      dVar3 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar14,iVar17 + 1,iVar13);
      dVar4 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar14,iVar17,iVar13);
      dVar5 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar14,iVar17,iVar13);
      *pVVar9 = (dVar4 - dVar5) * -dVar21 + (dVar2 - dVar3) * dVar23 + dVar1 * dVar20 + *pVVar9;
      iVar17 = iVar17 + 1;
    }
  }
  iVar13 = 0;
  while (iVar15 = iVar13, iVar15 != iVar18) {
    iVar14 = iVar10;
    iVar8 = 0;
    while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, iVar13 = iVar15 + 1, bVar19) {
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::jy(grid,iVar15,iVar12,iVar8);
      dVar1 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar15,iVar12,iVar8 + 1);
      dVar2 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar15,iVar12,iVar8);
      dVar3 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar15 + 1,iVar12,iVar8);
      dVar4 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar15,iVar12,iVar8);
      dVar5 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar15,iVar12,iVar8);
      *pVVar9 = (dVar4 - dVar5) * -dVar23 + (dVar2 - dVar3) * dVar22 + dVar1 * dVar20 + *pVVar9;
      iVar8 = iVar8 + 1;
    }
  }
  iVar12 = 0;
  while (iVar13 = iVar12, iVar13 != iVar11) {
    iVar15 = iVar10;
    iVar18 = 0;
    while (bVar19 = iVar15 != 0, iVar15 = iVar15 + -1, iVar12 = iVar13 + 1, bVar19) {
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::jx(grid,i,iVar13,iVar18);
      dVar23 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,i,iVar13 + 1,iVar18);
      dVar1 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,i,iVar13,iVar18);
      dVar2 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,i,iVar13,iVar18 + 1);
      dVar3 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::by(grid,i,iVar13,iVar18);
      dVar4 = *pVVar9;
      pVVar9 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,i,iVar13,iVar18);
      *pVVar9 = (dVar3 - dVar4) * -dVar22 + (dVar1 - dVar2) * dVar21 + dVar23 * dVar20 + *pVVar9;
      iVar18 = iVar18 + 1;
    }
  }
  return;
}

Assistant:

static void updateE(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        const ValueType coeffCurrent = -static_cast<ValueType>(4) * Constants<ValueType>::pi() * dt;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(0, 0, 0);
        const IndexType end = grid.getSize() - IndexType(1, 1, 1);
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.ex(i, j, k) += coeffCurrent * grid.jx(i, j, k) +
                coeff.y * (grid.bz(i, j + 1, k) - grid.bz(i, j, k)) -
                coeff.z * (grid.by(i, j, k + 1) - grid.by(i, j, k));
            grid.ey(i, j, k) += coeffCurrent * grid.jy(i, j, k) +
                coeff.z * (grid.bx(i, j, k + 1) - grid.bx(i, j, k)) -
                coeff.x * (grid.bz(i + 1, j, k) - grid.bz(i, j, k));
            grid.ez(i, j, k) += coeffCurrent * grid.jz(i, j, k) +
                coeff.x * (grid.by(i + 1, j, k) - grid.by(i, j, k)) -
                coeff.y * (grid.bx(i, j + 1, k) - grid.bx(i, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.ez(i, j, end.z) += coeffCurrent * grid.jz(i, j, end.z) +
                coeff.x * (grid.by(i + 1, j, end.z) - grid.by(i, j, end.z)) -
                coeff.y * (grid.bx(i, j + 1, end.z) - grid.bx(i, j, end.z));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.ey(i, end.y, k) += coeffCurrent * grid.jy(i, end.y, k) +
                coeff.z * (grid.bx(i, end.y, k + 1) - grid.bx(i, end.y, k)) -
                coeff.x * (grid.bz(i + 1, end.y, k) - grid.bz(i, end.y, k));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.ex(end.x, j, k) += coeffCurrent * grid.jx(end.x, j, k) +
                coeff.y * (grid.bz(end.x, j + 1, k) - grid.bz(end.x, j, k)) -
                coeff.z * (grid.by(end.x, j, k + 1) - grid.by(end.x, j, k));
    }